

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O0

string * __thiscall
phosg::readx_abi_cxx11_(string *__return_storage_ptr__,phosg *this,int fd,size_t size)

{
  int fd_00;
  char *data;
  undefined4 in_register_00000014;
  allocator<char> local_22;
  undefined1 local_21;
  size_type local_20;
  size_t size_local;
  string *psStack_10;
  int fd_local;
  string *ret;
  
  size_local._4_4_ = (int)this;
  local_21 = 0;
  local_20 = CONCAT44(in_register_00000014,fd);
  psStack_10 = __return_storage_ptr__;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,CONCAT44(in_register_00000014,fd),'\0',&local_22);
  ::std::allocator<char>::~allocator(&local_22);
  fd_00 = size_local._4_4_;
  data = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__);
  readx(fd_00,data,local_20);
  return __return_storage_ptr__;
}

Assistant:

string readx(int fd, size_t size) {
  string ret(size, 0);
  readx(fd, ret.data(), size);
  return ret;
}